

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

int matchbracketclass(int c,char *p,char *ec)

{
  int iVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *in_RDX;
  byte *in_RSI;
  uint in_EDI;
  int sig;
  uint local_1c;
  byte *local_10;
  
  local_10 = in_RSI;
  if (in_RSI[1] == 0x5e) {
    local_10 = in_RSI + 1;
  }
  local_1c = (uint)(in_RSI[1] != 0x5e);
  do {
    while( true ) {
      while( true ) {
        pbVar2 = local_10 + 1;
        if (in_RDX <= pbVar2) {
          return (uint)((local_1c != 0 ^ 0xffU) & 1);
        }
        if (*pbVar2 != 0x25) break;
        local_10 = local_10 + 2;
        iVar1 = match_class(in_EDI,(uint)*local_10);
        if (iVar1 != 0) {
          return local_1c;
        }
      }
      if ((local_10[2] == 0x2d) && (local_10 + 3 < in_RDX)) break;
      local_10 = pbVar2;
      if (*pbVar2 == in_EDI) {
        return local_1c;
      }
    }
    pbVar3 = local_10 + 3;
    pbVar2 = local_10 + 1;
    local_10 = pbVar3;
  } while (((int)in_EDI < (int)(uint)*pbVar2) || ((int)(uint)*pbVar3 < (int)in_EDI));
  return local_1c;
}

Assistant:

static int matchbracketclass(int c, const char *p, const char *ec)
{
  int sig = 1;
  if (*(p+1) == '^') {
    sig = 0;
    p++;  /* skip the `^' */
  }
  while (++p < ec) {
    if (*p == L_ESC) {
      p++;
      if (match_class(c, uchar(*p)))
	return sig;
    }
    else if ((*(p+1) == '-') && (p+2 < ec)) {
      p+=2;
      if (uchar(*(p-2)) <= c && c <= uchar(*p))
	return sig;
    }
    else if (uchar(*p) == c) return sig;
  }
  return !sig;
}